

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okiadpcm.c
# Opt level: O0

oki_adpcm_state * oki_adpcm_create(INT8 *custom_index_shift,INT16 *custom_diff_lookup)

{
  oki_adpcm_state *adpcm;
  INT16 *custom_diff_lookup_local;
  INT8 *custom_index_shift_local;
  
  custom_index_shift_local = (INT8 *)calloc(1,0x18);
  if ((oki_adpcm_state *)custom_index_shift_local == (oki_adpcm_state *)0x0) {
    custom_index_shift_local = (INT8 *)0x0;
  }
  else {
    oki_adpcm_init((oki_adpcm_state *)custom_index_shift_local,custom_index_shift,custom_diff_lookup
                  );
  }
  return (oki_adpcm_state *)custom_index_shift_local;
}

Assistant:

oki_adpcm_state* oki_adpcm_create(const INT8* custom_index_shift, const INT16* custom_diff_lookup)
{
	oki_adpcm_state* adpcm;
	
	adpcm = (oki_adpcm_state*)calloc(1, sizeof(oki_adpcm_state));
	if (adpcm == NULL)
		return NULL;
	
	oki_adpcm_init(adpcm, custom_index_shift, custom_diff_lookup);
	
	return adpcm;
}